

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_realtime_diagnoses.cc
# Opt level: O0

void anon_unknown.dwarf_1590ba::Json2Type
               (Value *value,RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType *item)

{
  bool bVar1;
  Value *pVVar2;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType *local_18;
  RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType *)value;
  bVar1 = Json::Value::isMember(value,"CreateTime");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"CreateTime");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"TaskId");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"TaskId");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->task_id,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"HealthScore");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"HealthScore");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->health_score,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Status");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Status");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->status,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType* item) {
  if(value.isMember("CreateTime")) {
    item->create_time = value["CreateTime"].asString();
  }
  if(value.isMember("TaskId")) {
    item->task_id = value["TaskId"].asString();
  }
  if(value.isMember("HealthScore")) {
    item->health_score = value["HealthScore"].asString();
  }
  if(value.isMember("Status")) {
    item->status = value["Status"].asString();
  }
}